

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilteringRegister.hpp
# Opt level: O2

void __thiscall
supermap::
FilteringRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>::
FilteringRegister(FilteringRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>
                  *this,function<std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_()>
                        *filterSupplier,
                 function<supermap::Key<128UL>_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&)>
                 *func)

{
  (this->
  super_StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
  ).
  super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>
  ._vptr_Cloneable = (_func_int **)&PTR_clone_001f8d50;
  std::function<std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_()>::operator()
            ((function<std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_()> *)
             &this->filter_);
  std::
  function<supermap::Key<128UL>_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&)>::
  function(&this->func_,func);
  return;
}

Assistant:

explicit FilteringRegister(
        std::function<std::shared_ptr<FilterBase>()> filterSupplier,
        std::function<FilterT(const RegisterT &)> func
    ) : filter_(filterSupplier()), func_(std::move(func)) {}